

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-dll2.h
# Opt level: O2

int lws_seq_check_wsi(lws_seq_t *seq,lws *wsi)

{
  lws_dll2 *plVar1;
  
  plVar1 = (lws_dll2 *)&seq->seq_event_owner;
  do {
    plVar1 = plVar1->next;
    if (plVar1 == (lws_dll2 *)0x0) break;
  } while ((*(int *)&plVar1[1].owner != 6) || ((lws *)plVar1[1].prev != wsi));
  return (int)(plVar1 != (lws_dll2 *)0x0);
}

Assistant:

static LWS_INLINE struct lws_dll2 *
lws_dll2_get_head(struct lws_dll2_owner *owner) { return owner->head; }